

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O2

void __thiscall
leveldb::anon_unknown_7::TwoLevelIterator::SetDataIterator
          (TwoLevelIterator *this,Iterator *data_iter)

{
  Iterator *pIVar1;
  Status local_20;
  
  pIVar1 = (this->data_iter_).iter_;
  if (pIVar1 != (Iterator *)0x0) {
    (*pIVar1->_vptr_Iterator[10])(&local_20);
    if (((this->status_).state_ == (char *)0x0) && (local_20.state_ != (char *)0x0)) {
      Status::operator=(&this->status_,&local_20);
    }
    Status::~Status(&local_20);
  }
  IteratorWrapper::Set(&this->data_iter_,data_iter);
  return;
}

Assistant:

void TwoLevelIterator::SetDataIterator(Iterator* data_iter) {
  if (data_iter_.iter() != nullptr) SaveError(data_iter_.status());
  data_iter_.Set(data_iter);
}